

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NetAliasSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NetAliasSyntax,slang::syntax::NetAliasSyntax_const&>
          (BumpAllocator *this,NetAliasSyntax *args)

{
  NetAliasSyntax *pNVar1;
  NetAliasSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pNVar1 = (NetAliasSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::NetAliasSyntax::NetAliasSyntax(in_RSI,pNVar1);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }